

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O3

void Sbd_ProblemPrintSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  Sbd_Str_t *pSVar5;
  int iVar6;
  
  puts("Solution found:");
  if (nStrs < 1) {
    iVar4 = 0;
  }
  else {
    uVar2 = 0;
    pSVar5 = pStr0;
    do {
      pcVar1 = "LUT";
      iVar4 = 1 << ((byte)pSVar5->nVarIns & 0x1f);
      if (pSVar5->fLut == 0) {
        pcVar1 = "SEL";
        iVar4 = pSVar5->nVarIns;
      }
      printf("%s%d : ",pcVar1,
             (ulong)(uint)((int)((ulong)((long)pSVar5 - (long)pStr0) >> 3) * -0x49249249));
      if (0 < iVar4) {
        iVar6 = (int)uVar2;
        do {
          if ((iVar6 < 0) || (vLits->nSize <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vLits->pArray[uVar2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          printf("%d",(ulong)(~vLits->pArray[uVar2] & 1));
          uVar2 = uVar2 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        uVar2 = uVar2 & 0xffffffff;
      }
      iVar4 = (int)uVar2;
      printf("    {");
      if (0 < pSVar5->nVarIns) {
        lVar3 = 0;
        do {
          printf(" %d",(ulong)(uint)pSVar5->VarIns[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < pSVar5->nVarIns);
      }
      puts(" }");
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 < pStr0 + nStrs);
  }
  if (iVar4 == vLits->nSize) {
    return;
  }
  __assert_fail("iLit == Vec_IntSize(vLits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                ,0x90,"void Sbd_ProblemPrintSolution(int, Sbd_Str_t *, Vec_Int_t *)");
}

Assistant:

void Sbd_ProblemPrintSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    printf( "Solution found:\n" );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        nIters = pStr->fLut ? 1 << pStr->nVarIns : pStr->nVarIns;
        printf( "%s%d : ", pStr->fLut ? "LUT":"SEL", (int)(pStr-pStr0) );
        for ( m = 0; m < nIters; m++, iLit++ )
            printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) );
        printf( "    {" );
        for ( m = 0; m < pStr->nVarIns; m++ )
            printf( " %d", pStr->VarIns[m] );
        printf( " }\n" );
    }
    assert( iLit == Vec_IntSize(vLits) );
}